

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ElabSystemTaskSymbol::reportStaticAssert
          (ElabSystemTaskSymbol *this,Scope *scope,SourceLocation loc,string_view message,
          Expression *condition)

{
  int *piVar1;
  ConstantValue *arg;
  ConstantValue *arg_00;
  bool bVar2;
  Diagnostic *pDVar3;
  int *piVar4;
  SourceLocation noteLocation;
  int *piVar5;
  string_view arg_01;
  Token opToken;
  allocator<char> local_59;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string local_48;
  
  piVar5 = (int *)message._M_str;
  local_58._M_str = (char *)message._M_len;
  local_58._M_len = (size_t)loc;
  if (((piVar5 != (int *)0x0) && (*(ConstantValue **)(piVar5 + 4) != (ConstantValue *)0x0)) &&
     (bVar2 = ConstantValue::isTrue(*(ConstantValue **)(piVar5 + 4)), bVar2)) {
    return;
  }
  pDVar3 = Scope::addDiag((Scope *)this,(DiagCode)0xc10006,(SourceLocation)scope);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_48,&local_58,&local_59);
  pDVar3 = Diagnostic::addStringAllowEmpty(pDVar3,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (((piVar5 != (int *)0x0) && (*piVar5 == 0xb)) && (piVar5[0x10] - 9U < 10)) {
    piVar4 = piVar5 + 6;
    do {
      piVar1 = *(int **)piVar4;
      piVar4 = piVar1 + 10;
    } while (*piVar1 == 0x167);
    local_48._M_dataplus._M_p = *(pointer *)(piVar1 + 8);
    local_48._M_string_length = *(size_type *)(piVar1 + 10);
    arg = *(ConstantValue **)(*(long *)(piVar5 + 0xc) + 0x10);
    arg_00 = *(ConstantValue **)(*(long *)(piVar5 + 0xe) + 0x10);
    noteLocation = parsing::Token::location((Token *)&local_48);
    pDVar3 = Diagnostic::addNote(pDVar3,(DiagCode)0xe60006,noteLocation);
    Diagnostic::operator<<(pDVar3,*(SourceRange *)(piVar5 + 8));
    pDVar3 = Diagnostic::operator<<(pDVar3,arg);
    arg_01 = parsing::Token::rawText((Token *)&local_48);
    pDVar3 = Diagnostic::operator<<(pDVar3,arg_01);
    Diagnostic::operator<<(pDVar3,arg_00);
  }
  return;
}

Assistant:

void ElabSystemTaskSymbol::reportStaticAssert(const Scope& scope, SourceLocation loc,
                                              std::string_view message,
                                              const Expression* condition) {
    if (condition && condition->constant) {
        // Issue no diagnostic if the assert condition is true.
        if (condition->constant->isTrue())
            return;
    }

    auto& diag = scope.addDiag(diag::StaticAssert, loc).addStringAllowEmpty(std::string(message));

    // If the condition is a comparison operator, note the value of both
    // sides to provide more info about why the assertion failed.
    if (condition && condition->kind == ExpressionKind::BinaryOp)
        reduceComparison(condition->as<BinaryExpression>(), diag);
}